

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::FinishTransferSwept(Recycler *this,CollectionFlags flags)

{
  ObservableValueObserver<Memory::CollectionState> *pOVar1;
  code *pcVar2;
  bool bVar3;
  CollectionState CVar4;
  undefined8 in_RAX;
  undefined4 *puVar5;
  RecyclerSweepManager *this_00;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if ((this->collectionState).value != CollectionStateTransferSweptWait) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1794,"(collectionState == CollectionStateTransferSweptWait)",
                       "collectionState == CollectionStateTransferSweptWait");
    if (!bVar3) goto LAB_00715035;
    *puVar5 = 0;
  }
  PrintCollectTrace(this,ConcurrentSweepPhase,true,false);
  uStack_28 = CONCAT44(0x202,(undefined4)uStack_28);
  pOVar1 = (this->collectionState).observer;
  CVar4 = CollectionStateTransferSwept;
  if ((pOVar1 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
     ((this->collectionState).value != CollectionStateTransferSwept)) {
    (**pOVar1->_vptr_ObservableValueObserver)(pOVar1,(long)&uStack_28 + 4,&this->collectionState);
    CVar4 = uStack_28._4_4_;
  }
  (this->collectionState).value = CVar4;
  if (DAT_015bf420 == '\x01') {
    bVar3 = HeapInfoManager::HasZeroQueuedPages(&this->autoHeap);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x179e,"(!autoHeap.HasZeroQueuedPages())","!autoHeap.HasZeroQueuedPages()"
                        );
      if (!bVar3) goto LAB_00715035;
      *puVar5 = 0;
    }
    HeapInfoManager::FlushBackgroundPages(&this->autoHeap);
  }
  this_00 = this->recyclerSweepManager;
  if (this_00 == (RecyclerSweepManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x17a6,"(this->recyclerSweepManager != nullptr)",
                       "this->recyclerSweepManager != nullptr");
    if (!bVar3) goto LAB_00715035;
    *puVar5 = 0;
    this_00 = this->recyclerSweepManager;
  }
  bVar3 = RecyclerSweepManager::IsBackground(this_00);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x17a7,"(!this->recyclerSweepManager->IsBackground())",
                       "!this->recyclerSweepManager->IsBackground()");
    if (!bVar3) {
LAB_00715035:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (this->inPartialCollectMode == true) {
    ConcurrentPartialTransferSweptObjects(this,this->recyclerSweepManager);
  }
  else {
    ConcurrentTransferSweptObjects(this,this->recyclerSweepManager);
  }
  RecyclerSweepManager::EndSweep(this->recyclerSweepManager);
  return;
}

Assistant:

void
Recycler::FinishTransferSwept(CollectionFlags flags)
{
    GCETW_INTERNAL(GC_START, (this, ETWEvent_ConcurrentTransferSwept));
    GCETW_INTERNAL(GC_START2, (this, ETWEvent_ConcurrentTransferSwept, this->collectionStartReason, this->collectionStartFlags));
    GCETW(GC_FLUSHZEROPAGE_START, (this));

    Assert(collectionState == CollectionStateTransferSweptWait);
#ifdef RECYCLER_TRACE
    PrintCollectTrace(Js::ConcurrentSweepPhase, true);
#endif
    SetCollectionState(CollectionStateTransferSwept);

#if ENABLE_BACKGROUND_PAGE_FREEING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        // We should have zeroed all the pages in the background thread
        Assert(!autoHeap.HasZeroQueuedPages());
        autoHeap.FlushBackgroundPages();
    }
#endif

    GCETW(GC_FLUSHZEROPAGE_STOP, (this));
    GCETW(GC_TRANSFERSWEPTOBJECTS_START, (this));

    Assert(this->recyclerSweepManager != nullptr);
    Assert(!this->recyclerSweepManager->IsBackground());
#if ENABLE_PARTIAL_GC
    if (this->inPartialCollectMode)
    {
        ConcurrentPartialTransferSweptObjects(*this->recyclerSweepManager);
    }
    else
#endif
    {
        ConcurrentTransferSweptObjects(*this->recyclerSweepManager);
    }
    recyclerSweepManager->EndSweep();

    GCETW(GC_TRANSFERSWEPTOBJECTS_STOP, (this));

    GCETW_INTERNAL(GC_STOP, (this, ETWEvent_ConcurrentTransferSwept));
    GCETW_INTERNAL(GC_STOP2, (this, ETWEvent_ConcurrentTransferSwept, this->collectionStartReason, this->collectionStartFlags));
}